

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
readFile(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
        string *file_name)

{
  size_type __n;
  allocator_type local_219;
  ifstream f;
  
  std::ifstream::ifstream(&f,(string *)file_name,_S_bin|_S_ate);
  __n = std::istream::tellg();
  std::istream::seekg((long)&f,_S_beg);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__n,&local_219);
  std::istream::read((char *)&f,
                     (long)(__return_storage_ptr__->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start);
  std::ifstream::~ifstream(&f);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> readFile(const std::string &file_name) {
  std::ifstream f(file_name, std::ios::binary | std::ios::ate);
  std::streamsize size = f.tellg();
  f.seekg(0, std::ios::beg);

  auto buffer = std::vector<uint8_t>(static_cast<unsigned long>(size));
  f.read((char *) buffer.data(), size);
  return buffer;
}